

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.hpp
# Opt level: O3

void __thiscall
Document::draw(Document *this,Path *path,Style *style,Transformation *transformation)

{
  shared_ptr<Paint> sStack_38;
  
  if (((style->fill).super___shared_ptr<PaintServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) && (0.0 < style->fill_opacity)) {
    Style::get_fill_paint((Style *)&sStack_38,(Transformation *)style);
    Path::fill(path,&this->shapes,&sStack_38);
    if (sStack_38.super___shared_ptr<Paint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (sStack_38.super___shared_ptr<Paint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  if ((((style->stroke).super___shared_ptr<PaintServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) && (0.0 < style->stroke_width)) && (0.0 < style->stroke_opacity)) {
    Style::get_stroke_paint((Style *)&sStack_38,(Transformation *)style);
    Path::stroke(path,&this->shapes,style->stroke_width,&sStack_38);
    if (sStack_38.super___shared_ptr<Paint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (sStack_38.super___shared_ptr<Paint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void draw(const Path& path, const Style& style, const Transformation& transformation = Transformation()) {
		if (style.fill && style.fill_opacity > 0.f) {
			fill(path, style.get_fill_paint(transformation));
		}
		if (style.stroke && style.stroke_width > 0.f && style.stroke_opacity > 0.f) {
			stroke(path, style.get_stroke_paint(transformation), style.stroke_width);
		}
	}